

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O2

Result * CoreML::validateFeatureDescriptions
                   (Result *__return_storage_ptr__,ModelDescription *interface,int modelVersion)

{
  int iVar1;
  Rep *pRVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  void **ppvVar6;
  allocator<char> local_59;
  ModelDescription *local_58;
  string local_50;
  
  lVar5 = (long)(interface->input_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar5 < 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Models must have one or more inputs.",&local_59);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_50);
  }
  else {
    if (0 < (interface->output_).super_RepeatedPtrFieldBase.current_size_) {
      pRVar2 = (interface->input_).super_RepeatedPtrFieldBase.rep_;
      ppvVar6 = pRVar2->elements;
      if (pRVar2 == (Rep *)0x0) {
        ppvVar6 = (void **)0x0;
      }
      local_58 = interface;
      for (lVar4 = 0; lVar5 * 8 != lVar4; lVar4 = lVar4 + 8) {
        validateFeatureDescription
                  (__return_storage_ptr__,*(FeatureDescription **)((long)ppvVar6 + lVar4),
                   modelVersion,true);
        bVar3 = Result::good(__return_storage_ptr__);
        if (!bVar3) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
      }
      pRVar2 = (local_58->output_).super_RepeatedPtrFieldBase.rep_;
      ppvVar6 = pRVar2->elements;
      if (pRVar2 == (Rep *)0x0) {
        ppvVar6 = (void **)0x0;
      }
      iVar1 = (local_58->output_).super_RepeatedPtrFieldBase.current_size_;
      lVar5 = 0;
      while( true ) {
        if ((long)iVar1 * 8 == lVar5) {
          Result::Result(__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        validateFeatureDescription
                  (__return_storage_ptr__,*(FeatureDescription **)((long)ppvVar6 + lVar5),
                   modelVersion,false);
        bVar3 = Result::good(__return_storage_ptr__);
        if (!bVar3) break;
        std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
        lVar5 = lVar5 + 8;
      }
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Models must have one or more outputs.",&local_59);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_50);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

Result validateFeatureDescriptions(const Specification::ModelDescription& interface, int modelVersion) {
        // a model must have at least one input and one output
        if (interface.input_size() < 1) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Models must have one or more inputs.");
        }
        if (interface.output_size() < 1) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Models must have one or more outputs.");
        }

        for (const auto& input : interface.input()) {
            Result r = validateFeatureDescription(input, modelVersion, true);
            if (!r.good()) { return r; }
        }

        for (const auto& output : interface.output()) {
            Result r = validateFeatureDescription(output, modelVersion, false);
            if (!r.good()) { return r; }
        }

        // If we got here, all inputs/outputs seem good independently of each other.
        return Result();
    }